

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas1_c.cpp
# Opt level: O0

void csrot(int n,complex<float> *cx,int incx,complex<float> *cy,int incy,float c,float s)

{
  float *pfVar1;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  complex<float> local_ac;
  complex<float> local_a4 [2];
  complex<float> local_94;
  complex<float> local_8c [2];
  complex<float> local_7c;
  complex<float> local_74 [2];
  complex<float> local_64;
  complex<float> local_5c [2];
  int local_4c;
  int local_48;
  int iy;
  int ix;
  int i;
  complex<float> ctemp;
  float local_30;
  float s_local;
  float c_local;
  int incy_local;
  complex<float> *cy_local;
  complex<float> *pcStack_18;
  int incx_local;
  complex<float> *cx_local;
  int n_local;
  
  ctemp._M_value._4_4_ = s;
  local_30 = c;
  s_local = (float)incy;
  _c_local = cy;
  cy_local._4_4_ = incx;
  pcStack_18 = cx;
  cx_local._4_4_ = n;
  std::complex<float>::complex((complex<float> *)&ix,0.0,0.0);
  if (0 < cx_local._4_4_) {
    if ((cy_local._4_4_ == 1) && (s_local == 1.4013e-45)) {
      for (iy = 0; iy < cx_local._4_4_; iy = iy + 1) {
        std::operator*(&local_30,pcStack_18 + iy);
        pfVar1 = (float *)((long)&ctemp._M_value + 4);
        std::operator*(pfVar1,_c_local + iy);
        std::operator+(local_5c,&local_64);
        _ix = CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
        std::operator*(&local_30,_c_local + iy);
        std::operator*(pfVar1,pcStack_18 + iy);
        std::operator-(local_74,&local_7c);
        _c_local[iy]._M_value = CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00);
        pcStack_18[iy]._M_value = _ix;
      }
    }
    else {
      if (cy_local._4_4_ < 0) {
        local_48 = (1 - cx_local._4_4_) * cy_local._4_4_;
      }
      else {
        local_48 = 0;
      }
      if ((int)s_local < 0) {
        local_4c = (1 - cx_local._4_4_) * (int)s_local;
      }
      else {
        local_4c = 0;
      }
      for (iy = 0; iy < cx_local._4_4_; iy = iy + 1) {
        std::operator*(&local_30,pcStack_18 + local_48);
        pfVar1 = (float *)((long)&ctemp._M_value + 4);
        std::operator*(pfVar1,_c_local + local_4c);
        std::operator+(local_8c,&local_94);
        _ix = CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01);
        std::operator*(&local_30,_c_local + local_4c);
        std::operator*(pfVar1,pcStack_18 + local_48);
        std::operator-(local_a4,&local_ac);
        _c_local[local_4c]._M_value = CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02);
        pcStack_18[local_48]._M_value = _ix;
        local_48 = local_48 + cy_local._4_4_;
        local_4c = local_4c + (int)s_local;
      }
    }
  }
  return;
}

Assistant:

void csrot ( int n, complex <float> cx[], int incx, complex <float> cy[],
  int incy, float c, float s )

//****************************************************************************80
//
//  Purpose:
//
//    CSROT applies a plane rotation.
//
//  Discussion:
//
//    This routine uses single precision complex arithmetic.
//
//    The cosine C and sine S are real and the vectors CX and CY are complex.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    11 April 2006
//
//  Author:
//
//    C++ version by John Burkardt
//
//  Reference:
//
//    Jack Dongarra, Jim Bunch, Cleve Moler, Pete Stewart,
//    LINPACK User's Guide,
//    SIAM, 1979,
//    ISBN13: 978-0-898711-72-1,
//    LC: QA214.L56.
//
//    Charles Lawson, Richard Hanson, David Kincaid, Fred Krogh,
//    Basic Linear Algebra Subprograms for Fortran Usage,
//    Algorithm 539,
//    ACM Transactions on Mathematical Software,
//    Volume 5, Number 3, September 1979, pages 308-323.
//
//  Parameters:
//
//    Input, int N, the number of entries in the vectors.
//
//    Input/output, complex <float> CX[], one of the vectors to be rotated.
//
//    Input, int INCX, the increment between successive entries of CX.
//
//    Input/output, complex <float> CY[], one of the vectors to be rotated.
//
//    Input, int INCY, the increment between successive elements of CY.
//
//    Input, float C, S, parameters (presumably the cosine and sine of
//    some angle) that define a plane rotation.
//
{
  complex <float> ctemp;
  int i;
  int ix;
  int iy;

  if ( n <= 0 )
  {
    return;
  }

  if ( incx == 1 && incy == 1 )
  {
    for ( i = 0; i < n; i++ )
    {
      ctemp = c * cx[i] + s * cy[i];
      cy[i] = c * cy[i] - s * cx[i];
      cx[i] = ctemp;
    }
  }
  else
  {
    if ( 0 <= incx )
    {
      ix = 0;
    }
    else
    {
      ix = ( -n + 1 ) * incx;
    }

    if ( 0 <= incy )
    {
      iy = 0;
    }
    else
    {
      iy = ( -n + 1 ) * incy;
    }

    for ( i = 0; i < n; i++ )
    {
      ctemp  = c * cx[ix] + s * cy[iy];
      cy[iy] = c * cy[iy] - s * cx[ix];
      cx[ix] = ctemp;
      ix = ix + incx;
      iy = iy + incy;
    }
  }
  return;
}